

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameterio.cpp
# Opt level: O0

void anon_unknown.dwarf_8d21::LoadParameters
               (FILE *fp,int *number_of_frames,int *fft_size,int *number_of_dimensions)

{
  int local_38;
  undefined1 local_34 [8];
  char data_check [12];
  int *number_of_dimensions_local;
  int *fft_size_local;
  int *number_of_frames_local;
  FILE *fp_local;
  
  data_check._4_8_ = number_of_dimensions;
  fread(local_34,1,4,(FILE *)fp);
  fread(number_of_frames,4,1,(FILE *)fp);
  fread(local_34,1,0xc,(FILE *)fp);
  fread(local_34,1,4,(FILE *)fp);
  fread(fft_size,4,1,(FILE *)fp);
  fread(local_34,1,4,(FILE *)fp);
  fread((void *)data_check._4_8_,4,1,(FILE *)fp);
  if (*(int *)data_check._4_8_ == 0) {
    local_38 = *fft_size / 2 + 1;
  }
  else {
    local_38 = *(int *)data_check._4_8_;
  }
  *(int *)data_check._4_8_ = local_38;
  fread(local_34,1,8,(FILE *)fp);
  return;
}

Assistant:

static void LoadParameters(FILE *fp, int *number_of_frames, int *fft_size,
    int *number_of_dimensions) {
  char data_check[12];
  fread(&data_check, 1, 4, fp);  // NOF
  fread(number_of_frames, 4, 1, fp);

  fread(&data_check, 1, 12, fp);  // FP (skipped)

  fread(&data_check, 1, 4, fp);  // FFT
  fread(fft_size, 4, 1, fp);

  fread(&data_check, 1, 4, fp);  // NOD
  fread(number_of_dimensions, 4, 1, fp);
  *number_of_dimensions =
    *number_of_dimensions == 0 ? *fft_size / 2 + 1 : *number_of_dimensions;

  fread(&data_check, 1, 8, fp);  // FS (skipped)
}